

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndirectComputeDispatchTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::IndirectComputeDispatchTests::init
          (IndirectComputeDispatchTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  pointer pcVar2;
  deIntptr dVar3;
  uint uVar4;
  undefined8 in_RAX;
  ulong uVar5;
  TestNode *pTVar6;
  undefined8 uVar7;
  long lVar8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
  *pvVar9;
  value_type local_68;
  GenBuffer local_4c;
  TestNode *local_48;
  uint local_3c;
  TestNode *local_38;
  
  uVar5 = CONCAT71((int7)((ulong)in_RAX >> 8),init()::s_singleDispatchCases);
  if (init()::s_singleDispatchCases == '\0') {
    uVar4 = init((EVP_PKEY_CTX *)this);
    uVar5 = (ulong)uVar4;
  }
  uVar7 = CONCAT71((int7)(uVar5 >> 8),1);
  lVar8 = 0;
  local_38 = (TestNode *)this;
  do {
    local_3c = (uint)uVar7;
    local_4c = init::s_genBuffer[lVar8].gen;
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,init::s_genBuffer[lVar8].name,
               SSBOArrayLengthTests::init::arraysSized + 1);
    local_48 = pTVar6;
    tcu::TestNode::addChild((TestNode *)this,pTVar6);
    lVar8 = 0;
    do {
      pTVar6 = (TestNode *)operator_new(0xb0);
      pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pcVar2 = *(pointer *)
                ((long)init::s_singleDispatchCases[0].workGroupSize.m_data + lVar8 + -0x10);
      dVar3 = *(deIntptr *)((long)init::s_singleDispatchCases[0].workGroupSize.m_data + lVar8 + -8);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar6,pCVar1->m_testCtx,
                 *(char **)((long)init::s_singleDispatchCases[0].workGroupSize.m_data +
                           lVar8 + -0x20),
                 *(char **)((long)(&init::s_singleDispatchCases[0].workGroupSize + -2) + lVar8));
      pTVar6[1]._vptr_TestNode = (_func_int **)pCVar1;
      *(GenBuffer *)&pTVar6[1].m_testCtx = local_4c;
      *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
      pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar6[1].m_description._M_string_length = 0;
      pTVar6->_vptr_TestNode = (_func_int **)&PTR__IndirectDispatchCase_00b33b78;
      pTVar6[1].m_name._M_dataplus._M_p = pcVar2;
      *(undefined4 *)&pTVar6[1].m_name.field_2 =
           *(undefined4 *)((long)init::s_singleDispatchCases[0].workGroupSize.m_data + lVar8 + 8);
      pTVar6[1].m_name._M_string_length =
           *(size_type *)((long)init::s_singleDispatchCases[0].workGroupSize.m_data + lVar8);
      local_68.numWorkGroups.m_data[2] =
           *(uint *)((long)init::s_singleDispatchCases[0].numWorkGroups.m_data + lVar8 + 8);
      local_68.numWorkGroups.m_data._0_8_ =
           *(undefined8 *)((long)init::s_singleDispatchCases[0].numWorkGroups.m_data + lVar8);
      local_68.offset = dVar3;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                   *)((long)&pTVar6[1].m_name.field_2 + 8),&local_68);
      tcu::TestNode::addChild(local_48,pTVar6);
      this = (IndirectComputeDispatchTests *)local_38;
      lVar8 = lVar8 + 0x38;
    } while (lVar8 != 0x188);
    pTVar6 = (TestNode *)operator_new(0xb0);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,pCVar1->m_testCtx,"multi_dispatch",
               "Dispatch multiple compute commands from single buffer");
    pTVar6[1]._vptr_TestNode = (_func_int **)pCVar1;
    *(GenBuffer *)&pTVar6[1].m_testCtx = local_4c;
    pvVar9 = (vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
              *)(&pTVar6[1].m_name.field_2._M_allocated_capacity + 1);
    *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
    pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar6[1].m_description._M_string_length = 0;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__IndirectDispatchCase_00b33c18;
    pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x400;
    pTVar6[1].m_name._M_string_length = 0x100000003;
    *(undefined4 *)&pTVar6[1].m_name.field_2 = 2;
    local_68.offset = 0;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0xc;
    local_68.numWorkGroups.m_data[0] = 2;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0x68;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 3;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0x28;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 7;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0x34;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 4;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    tcu::TestNode::addChild(local_48,pTVar6);
    pTVar6 = (TestNode *)operator_new(0xb0);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,pCVar1->m_testCtx,"multi_dispatch_reuse_command",
               "Dispatch multiple compute commands from single buffer");
    pTVar6[1]._vptr_TestNode = (_func_int **)pCVar1;
    *(GenBuffer *)&pTVar6[1].m_testCtx = local_4c;
    pvVar9 = (vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
              *)(&pTVar6[1].m_name.field_2._M_allocated_capacity + 1);
    *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
    pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar6[1].m_description._M_string_length = 0;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__IndirectDispatchCase_00b33c68;
    pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x400;
    pTVar6[1].m_name._M_string_length = 0x100000003;
    *(undefined4 *)&pTVar6[1].m_name.field_2 = 2;
    local_68.offset = 0;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0x68;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 3;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0x68;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 3;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0x34;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 4;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    local_68.offset = 0x34;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 4;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar9,&local_68);
    tcu::TestNode::addChild(local_48,pTVar6);
    lVar8 = 1;
    uVar7 = 0;
  } while ((local_3c & 1) != 0);
  return 0;
}

Assistant:

void IndirectComputeDispatchTests::init (void)
{
	static const struct
	{
		const char*		name;
		GenBuffer		gen;
	} s_genBuffer[] =
	{
		{ "upload_buffer",		GEN_BUFFER_UPLOAD	},
		{ "gen_in_compute",		GEN_BUFFER_COMPUTE	}
	};

	static const struct
	{
		const char*	name;
		const char*	description;
		deUintptr	bufferSize;
		deUintptr	offset;
		UVec3		workGroupSize;
		UVec3		numWorkGroups;
	} s_singleDispatchCases[] =
	{
	//	Name										Desc											BufferSize					Offs			WorkGroupSize	NumWorkGroups
		{ "single_invocation",						"Single invocation only from offset 0",			INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(1,1,1) },
		{ "multiple_groups",						"Multiple groups dispatched from offset 0",		INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(2,3,5) },
		{ "multiple_groups_multiple_invocations",	"Multiple groups of size 2x3x1 from offset 0",	INDIRECT_COMMAND_SIZE,		0,				UVec3(2,3,1),	UVec3(1,2,3) },
		{ "small_offset",							"Small offset",									16+INDIRECT_COMMAND_SIZE,	16,				UVec3(1,1,1),	UVec3(1,1,1) },
		{ "large_offset",							"Large offset",									(2<<20),					(1<<20) + 12,	UVec3(1,1,1),	UVec3(1,1,1) },
		{ "large_offset_multiple_invocations",		"Large offset, multiple invocations",			(2<<20),					(1<<20) + 12,	UVec3(2,3,1),	UVec3(1,2,3) },
		{ "empty_command",							"Empty command",								INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(0,0,0) },
	};

	for (int genNdx = 0; genNdx < DE_LENGTH_OF_ARRAY(s_genBuffer); genNdx++)
	{
		const GenBuffer				genBuf		= s_genBuffer[genNdx].gen;
		tcu::TestCaseGroup* const	genGroup	= new tcu::TestCaseGroup(m_testCtx, s_genBuffer[genNdx].name, "");
		addChild(genGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_singleDispatchCases); ndx++)
			genGroup->addChild(new SingleDispatchCase(m_context,
													  s_singleDispatchCases[ndx].name,
													  s_singleDispatchCases[ndx].description,
													  genBuf,
													  s_singleDispatchCases[ndx].bufferSize,
													  s_singleDispatchCases[ndx].offset,
													  s_singleDispatchCases[ndx].workGroupSize,
													  s_singleDispatchCases[ndx].numWorkGroups));

		genGroup->addChild(new MultiDispatchCase				(m_context, genBuf));
		genGroup->addChild(new MultiDispatchReuseCommandCase	(m_context, genBuf));
	}
}